

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O3

int rtr_bgpsec_append_sig_seg(rtr_bgpsec *bgpsec,rtr_signature_seg *new_seg)

{
  long lVar1;
  rtr_signature_seg *prVar2;
  rtr_signature_seg *prVar3;
  rtr_signature_seg *prVar4;
  rtr_signature_seg *prVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = -1;
  if (((new_seg != (rtr_signature_seg *)0x0) && (new_seg->signature != (uint8_t *)0x0)) &&
     (new_seg->sig_len != 0)) {
    prVar2 = bgpsec->sigs;
    iVar6 = ski_is_empty(new_seg->ski);
    if (iVar6 == 0) {
      prVar3 = bgpsec->sigs;
      prVar5 = (rtr_signature_seg *)&bgpsec->sigs;
      while (prVar4 = prVar2, prVar3 != (rtr_signature_seg *)0x0) {
        prVar3 = prVar4->next;
        prVar2 = prVar3;
        prVar5 = prVar4;
      }
      prVar5->next = new_seg;
      bgpsec->sigs_len = bgpsec->sigs_len + 1;
      iVar7 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

int rtr_bgpsec_append_sig_seg(struct rtr_bgpsec *bgpsec, struct rtr_signature_seg *new_seg)
{
	struct rtr_signature_seg *last = bgpsec->sigs;

	if (!new_seg || !new_seg->signature || !new_seg->sig_len || ski_is_empty(new_seg->ski))
		return RTR_BGPSEC_ERROR;

	if (bgpsec->sigs) {
		while (last->next)
			last = last->next;
		last->next = new_seg;
	} else {
		bgpsec->sigs = new_seg;
	}

	bgpsec->sigs_len++;

	return RTR_BGPSEC_SUCCESS;
}